

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

void __thiscall AddrManImpl::SwapRandom(AddrManImpl *this,uint nRndPos1,uint nRndPos2)

{
  pointer plVar1;
  ulong uVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  nid_type nId2;
  nid_type nId1;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (nRndPos1 != nRndPos2) {
    uVar2 = (ulong)nRndPos1;
    plVar1 = (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)plVar1 >> 3;
    if ((uVar5 <= uVar2) || (uVar6 = (ulong)nRndPos2, uVar5 <= uVar6)) {
      __assert_fail("nRndPos1 < vRandom.size() && nRndPos2 < vRandom.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                    ,0x1b7,"void AddrManImpl::SwapRandom(unsigned int, unsigned int) const");
    }
    local_40 = plVar1[uVar2];
    local_48 = plVar1[uVar6];
    cVar3 = std::
            _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->mapInfo)._M_h,&local_40);
    cVar4 = std::
            _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->mapInfo)._M_h,&local_48);
    if (cVar3.super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>._M_cur ==
        (__node_type *)0x0) {
      __assert_fail("it_1 != mapInfo.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                    ,0x1be,"void AddrManImpl::SwapRandom(unsigned int, unsigned int) const");
    }
    if (cVar4.super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>._M_cur ==
        (__node_type *)0x0) {
      __assert_fail("it_2 != mapInfo.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                    ,0x1bf,"void AddrManImpl::SwapRandom(unsigned int, unsigned int) const");
    }
    *(uint *)((long)cVar3.super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>._M_cur +
             0x8c) = nRndPos2;
    *(uint *)((long)cVar4.super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>._M_cur +
             0x8c) = nRndPos1;
    plVar1 = (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar1[uVar2] = local_48;
    plVar1[uVar6] = local_40;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::SwapRandom(unsigned int nRndPos1, unsigned int nRndPos2) const
{
    AssertLockHeld(cs);

    if (nRndPos1 == nRndPos2)
        return;

    assert(nRndPos1 < vRandom.size() && nRndPos2 < vRandom.size());

    nid_type nId1 = vRandom[nRndPos1];
    nid_type nId2 = vRandom[nRndPos2];

    const auto it_1{mapInfo.find(nId1)};
    const auto it_2{mapInfo.find(nId2)};
    assert(it_1 != mapInfo.end());
    assert(it_2 != mapInfo.end());

    it_1->second.nRandomPos = nRndPos2;
    it_2->second.nRandomPos = nRndPos1;

    vRandom[nRndPos1] = nId2;
    vRandom[nRndPos2] = nId1;
}